

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

Uint32 Diligent::GetPrimitiveCount(PRIMITIVE_TOPOLOGY Topology,Uint32 Elements)

{
  uint *puVar1;
  Char *pCVar2;
  undefined1 local_78 [8];
  string msg_1;
  uint local_50;
  uint local_4c;
  uint local_48;
  undefined1 local_38 [8];
  string msg;
  Uint32 Elements_local;
  PRIMITIVE_TOPOLOGY Topology_local;
  
  if ((Topology < PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST) ||
     (PRIMITIVE_TOPOLOGY_32_CONTROL_POINT_PATCHLIST < Topology)) {
    msg.field_2._12_4_ = Elements;
    switch(Topology) {
    case PRIMITIVE_TOPOLOGY_UNDEFINED:
      FormatString<char[29]>((string *)local_38,(char (*) [29])"Undefined primitive topology");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"GetPrimitiveCount",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x8bf);
      std::__cxx11::string::~string((string *)local_38);
      Elements_local = 0;
      break;
    case PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
      Elements_local = Elements / 3;
      break;
    case PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
      local_48 = 2;
      puVar1 = std::max<unsigned_int>
                         ((uint *)(msg.field_2._M_local_buf + 0xc),&stack0xffffffffffffffb8);
      Elements_local = *puVar1 - 2;
      break;
    case PRIMITIVE_TOPOLOGY_POINT_LIST:
      Elements_local = Elements;
      break;
    case PRIMITIVE_TOPOLOGY_LINE_LIST:
      Elements_local = Elements >> 1;
      break;
    case PRIMITIVE_TOPOLOGY_LINE_STRIP:
      local_4c = 1;
      puVar1 = std::max<unsigned_int>
                         ((uint *)(msg.field_2._M_local_buf + 0xc),&stack0xffffffffffffffb4);
      Elements_local = *puVar1 - 1;
      break;
    case PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_ADJ:
      Elements_local = Elements / 6;
      break;
    case PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_ADJ:
      local_50 = 4;
      puVar1 = std::max<unsigned_int>
                         ((uint *)(msg.field_2._M_local_buf + 0xc),&stack0xffffffffffffffb0);
      Elements_local = *puVar1 - 4;
      break;
    case PRIMITIVE_TOPOLOGY_LINE_LIST_ADJ:
      Elements_local = Elements >> 2;
      break;
    case PRIMITIVE_TOPOLOGY_LINE_STRIP_ADJ:
      msg_1.field_2._12_4_ = 3;
      puVar1 = std::max<unsigned_int>
                         ((uint *)(msg.field_2._M_local_buf + 0xc),
                          (uint *)(msg_1.field_2._M_local_buf + 0xc));
      Elements_local = *puVar1 - 3;
      break;
    default:
      FormatString<char[30]>((string *)local_78,(char (*) [30])"Unexpected primitive topology");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"GetPrimitiveCount",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x8cd);
      std::__cxx11::string::~string((string *)local_78);
      Elements_local = 0;
    }
  }
  else {
    Elements_local = Elements / (Topology - 9);
  }
  return Elements_local;
}

Assistant:

inline Uint32 GetPrimitiveCount(PRIMITIVE_TOPOLOGY Topology, Uint32 Elements)
{
    if (Topology >= PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST && Topology <= PRIMITIVE_TOPOLOGY_32_CONTROL_POINT_PATCHLIST)
    {
        return Elements / (Topology - PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST + 1);
    }
    else
    {
        switch (Topology)
        {
            case PRIMITIVE_TOPOLOGY_UNDEFINED:
                UNEXPECTED("Undefined primitive topology");
                return 0;

                // clang-format off
            case PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:      return Elements / 3;
            case PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:     return (std::max)(Elements, 2u) - 2;
            case PRIMITIVE_TOPOLOGY_POINT_LIST:         return Elements;
            case PRIMITIVE_TOPOLOGY_LINE_LIST:          return Elements / 2;
            case PRIMITIVE_TOPOLOGY_LINE_STRIP:         return (std::max)(Elements, 1u) - 1;
            case PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_ADJ:  return Elements / 6;
            case PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_ADJ: return (std::max)(Elements, 4u) - 4;
            case PRIMITIVE_TOPOLOGY_LINE_LIST_ADJ:      return Elements / 4;
            case PRIMITIVE_TOPOLOGY_LINE_STRIP_ADJ:     return (std::max)(Elements, 3u) - 3;
            // clang-format on
            default: UNEXPECTED("Unexpected primitive topology"); return 0;
        }
    }
}